

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall hiberlite::Database::createModel(Database *this)

{
  bool bVar1;
  logic_error *this_00;
  pointer ppVar2;
  pointer ppVar3;
  string local_110 [32];
  _Base_ptr local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  Column *col;
  _Self local_b8;
  iterator c;
  string local_a8 [7];
  bool needComma;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [8];
  string query;
  Table *t;
  _Self local_58;
  iterator it;
  Model mdl;
  Database *this_local;
  
  if (this->mx == (ModelExtractor *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"register bean classes first");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  ModelExtractor::getModel((Model *)&it,this->mx);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                *)&it);
  while( true ) {
    t = (Table *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                        *)&it);
    bVar1 = std::operator!=(&local_58,(_Self *)&t);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>
             ::operator->(&local_58);
    std::operator+((char *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "CREATE TABLE ");
    std::operator+(local_88,(char *)local_a8);
    std::__cxx11::string::~string(local_a8);
    c._M_node._7_1_ = 0;
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Column,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Column>_>_>
         ::begin(&(ppVar2->second).columns);
    while( true ) {
      col = (Column *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Column,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Column>_>_>
            ::end(&(ppVar2->second).columns);
      bVar1 = std::operator!=(&local_b8,(_Self *)&col);
      if (!bVar1) break;
      if ((c._M_node._7_1_ & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_88,", ");
      }
      c._M_node._7_1_ = 1;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Column>_>
               ::operator->(&local_b8);
      local_c8 = &(ppVar3->second).name;
      std::operator+(local_e8,(char *)local_c8);
      std::__cxx11::string::operator+=((string *)local_88,(string *)local_e8);
      std::__cxx11::string::~string((string *)local_e8);
      bVar1 = std::operator==(local_c8,"hiberlite_id");
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_88,"INTEGER PRIMARY KEY AUTOINCREMENT");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_88,(string *)(local_c8 + 0x20));
      }
      local_f0 = (_Base_ptr)
                 std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Column>_>
                 ::operator++(&local_b8,0);
    }
    std::__cxx11::string::operator+=((string *)local_88,");");
    std::__cxx11::string::string(local_110,(string *)local_88);
    dbExecQuery(this,(string *)local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string((string *)local_88);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>
    ::operator++(&local_58,0);
  }
  Model::~Model((Model *)&it);
  return;
}

Assistant:

void Database::createModel()
{
	if(!mx)
		throw std::logic_error("register bean classes first");
	Model mdl=mx->getModel();
	for(Model::iterator it=mdl.begin();it!=mdl.end();it++){
		Table& t=it->second;
		std::string query="CREATE TABLE "+t.name+" (";
		bool needComma=false;
		for(std::map<std::string,Column>::iterator c=t.columns.begin();c!=t.columns.end();c++){
			if(needComma)
				query+=", ";
			needComma=true;
			Column& col=c->second;
			query += col.name + " ";
			if(col.name==HIBERLITE_PRIMARY_KEY_COLUMN)
				query+="INTEGER PRIMARY KEY AUTOINCREMENT";
			else
				query+=col.storage_type;
		}
		query +=");";
		dbExecQuery(query);
	}
}